

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O0

void __thiscall
pbrt::MLTIntegrator::MLTIntegrator
          (MLTIntegrator *this,Camera *camera,Primitive *aggregate,
          vector<pbrt::Light,_std::allocator<pbrt::Light>_> *lights,int maxDepth,int nBootstrap,
          int nChains,int mutationsPerPixel,Float sigma,Float largeStepProbability,bool regularize)

{
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *v;
  span<const_pbrt::Light> *in_RDX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  byte in_stack_00000018;
  PowerLightSampler *in_stack_00000198;
  Allocator in_stack_000001a0;
  undefined1 in_stack_000001a8 [16];
  PowerLightSampler *in_stack_ffffffffffffff38;
  Camera *in_stack_ffffffffffffff40;
  polymorphic_allocator<std::byte> *this_00;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *in_stack_ffffffffffffff88;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *in_stack_ffffffffffffff90;
  vector<pbrt::Light,_std::allocator<pbrt::Light>_> *in_stack_ffffffffffffffb0;
  Primitive *in_stack_ffffffffffffffb8;
  Integrator *in_stack_ffffffffffffffc0;
  
  Primitive::Primitive
            ((Primitive *)in_stack_ffffffffffffff40,(Primitive *)in_stack_ffffffffffffff38);
  std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Integrator::Integrator
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::vector<pbrt::Light,_std::allocator<pbrt::Light>_>::~vector
            ((vector<pbrt::Light,_std::allocator<pbrt::Light>_> *)in_RDX);
  *in_RDI = &PTR__MLTIntegrator_037ffb10;
  Camera::Camera(in_stack_ffffffffffffff40,(Camera *)in_stack_ffffffffffffff38);
  *(byte *)(in_RDI + 9) = in_stack_00000018 & 1;
  this_00 = (polymorphic_allocator<std::byte> *)(in_RDI + 10);
  v = (vector<pbrt::Light,_std::allocator<pbrt::Light>_> *)operator_new(0x68);
  pstd::span<const_pbrt::Light>::span<pbrt::Light>(in_RDX,v);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(this_00);
  PowerLightSampler::PowerLightSampler
            (in_stack_00000198,(span<const_pbrt::Light>)in_stack_000001a8,in_stack_000001a0);
  LightSampler::TaggedPointer<pbrt::PowerLightSampler>
            ((LightSampler *)this_00,in_stack_ffffffffffffff38);
  *(undefined4 *)(in_RDI + 0xb) = in_R8D;
  *(undefined4 *)((long)in_RDI + 0x5c) = in_R9D;
  *(undefined4 *)(in_RDI + 0xc) = in_stack_00000010;
  *(undefined4 *)((long)in_RDI + 100) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 0xd) = in_XMM1_Da;
  *(undefined4 *)((long)in_RDI + 0x6c) = in_stack_00000008;
  return;
}

Assistant:

MLTIntegrator(Camera camera, Primitive aggregate, std::vector<Light> lights,
                  int maxDepth, int nBootstrap, int nChains, int mutationsPerPixel,
                  Float sigma, Float largeStepProbability, bool regularize)
        : Integrator(aggregate, lights),
          lightSampler(new PowerLightSampler(lights, Allocator())),
          camera(camera),
          maxDepth(maxDepth),
          nBootstrap(nBootstrap),
          nChains(nChains),
          mutationsPerPixel(mutationsPerPixel),
          sigma(sigma),
          largeStepProbability(largeStepProbability),
          regularize(regularize) {}